

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::TestPlusArgsFunction::TestPlusArgsFunction
          (TestPlusArgsFunction *this,Builtins *builtins)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_41;
  Type *local_40;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_38;
  
  local_40 = &(builtins->stringType).super_Type;
  __l._M_len = 1;
  __l._M_array = &local_40;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_38,__l,&local_41);
  NonConstantFunction::NonConstantFunction
            (&this->super_NonConstantFunction,TestPlusArgs,(Type *)&builtins->intType,1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_38,false);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_38);
  (this->super_NonConstantFunction).super_SimpleSystemSubroutine.super_SystemSubroutine.
  _vptr_SystemSubroutine = (_func_int **)&PTR__SimpleSystemSubroutine_005a3ad8;
  return;
}

Assistant:

TestPlusArgsFunction(const Builtins& builtins) :
        NonConstantFunction(KnownSystemName::TestPlusArgs, builtins.intType, 1,
                            std::vector<const Type*>{&builtins.stringType}) {}